

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O3

void labelsize_cb(Fl_Value_Input *i,void *v)

{
  int iVar1;
  Fl_Fontsize FVar2;
  Fl_Widget_Type *q;
  Fl_Widget_Type *this;
  bool bVar3;
  
  if ((char *)v == "LOAD") {
    FVar2 = (current_widget->o->label_).size;
  }
  else {
    FVar2 = (Fl_Fontsize)(i->super_Fl_Valuator).value_;
    if (FVar2 < 1) {
      FVar2 = Fl_Widget_Type::default_size;
    }
    if (Fl_Type::first != (Fl_Type *)0x0) {
      bVar3 = true;
      this = (Fl_Widget_Type *)Fl_Type::first;
      do {
        while (((this->super_Fl_Type).selected != '\0' &&
               (iVar1 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x17])(this), iVar1 != 0))) {
          (this->o->label_).size = FVar2;
          Fl_Widget_Type::redraw(this);
          this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
          bVar3 = false;
          if (this == (Fl_Widget_Type *)0x0) goto LAB_00184d20;
        }
        this = (Fl_Widget_Type *)(this->super_Fl_Type).next;
      } while (this != (Fl_Widget_Type *)0x0);
      if (!bVar3) {
LAB_00184d20:
        set_modflag(1);
      }
    }
  }
  Fl_Valuator::value(&i->super_Fl_Valuator,(double)FVar2);
  return;
}

Assistant:

void labelsize_cb(Fl_Value_Input* i, void *v) {
  int n;
  if (v == LOAD) {
    n = current_widget->o->labelsize();
  } else {
    int mod = 0;
    n = int(i->value());
    if (n <= 0) n = Fl_Widget_Type::default_size;
    for (Fl_Type *o = Fl_Type::first; o; o = o->next) {
      if (o->selected && o->is_widget()) {
	Fl_Widget_Type* q = (Fl_Widget_Type*)o;
	q->o->labelsize(n);
	q->redraw();
	mod = 1;
      }
    }
    if (mod) set_modflag(1);
  }
  i->value(n);
}